

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_pretransfer(Curl_easy *data)

{
  unsigned_long *puVar1;
  char *pcVar2;
  size_t amount;
  unsigned_long uVar3;
  long lVar4;
  ulong uVar5;
  CURLcode CVar6;
  size_t sVar7;
  
  pcVar2 = (data->change).url;
  if (pcVar2 == (char *)0x0) {
    Curl_failf(data,"No URL set!");
    return CURLE_URL_MALFORMAT;
  }
  if ((data->change).url_alloc == true) {
    (*Curl_cfree)(pcVar2);
    (data->change).url_alloc = false;
  }
  amount = (data->set).general_ssl.max_ssl_sessions;
  (data->change).url = (data->set).str[0x19];
  CVar6 = Curl_ssl_initsessions(data,amount);
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  (data->state).wildcardmatch = (data->set).wildcard_enabled;
  (data->set).followlocation = 0;
  (data->state).this_is_a_follow = false;
  (data->state).errorbuf = false;
  (data->state).httpversion = 0;
  (data->state).authproblem = false;
  uVar3 = (data->set).proxyauth;
  (data->state).authhost.want = (data->set).httpauth;
  (data->state).authproxy.want = uVar3;
  (*Curl_cfree)((data->info).wouldredirect);
  (data->info).wouldredirect = (char *)0x0;
  if ((data->set).httpreq == HTTPREQ_PUT) {
    sVar7 = (data->set).filesize;
  }
  else {
    pcVar2 = (char *)(data->set).postfields;
    lVar4 = (data->set).postfieldsize;
    (data->state).infilesize = lVar4;
    if (lVar4 != -1 || pcVar2 == (char *)0x0) goto LAB_0012bbee;
    sVar7 = strlen(pcVar2);
  }
  (data->state).infilesize = sVar7;
LAB_0012bbee:
  if ((data->change).cookielist != (curl_slist *)0x0) {
    Curl_cookie_loadfiles(data);
  }
  if (((data->change).resolve == (curl_slist *)0x0) ||
     (CVar6 = Curl_loadhostpairs(data), CVar6 == CURLE_OK)) {
    (data->state).allow_port = true;
    Curl_initinfo(data);
    Curl_pgrsResetTransferSizes(data);
    Curl_pgrsStartNow(data);
    lVar4 = (data->set).timeout;
    if (lVar4 != 0) {
      Curl_expire(data,lVar4,EXPIRE_TIMEOUT);
    }
    lVar4 = (data->set).connecttimeout;
    if (lVar4 != 0) {
      Curl_expire(data,lVar4,EXPIRE_CONNECTTIMEOUT);
    }
    uVar5 = (data->state).authproxy.want;
    puVar1 = &(data->state).authhost.picked;
    *puVar1 = *puVar1 & (data->state).authhost.want;
    puVar1 = &(data->state).authproxy.picked;
    *puVar1 = *puVar1 & uVar5;
    CVar6 = CURLE_OK;
    if ((data->state).wildcardmatch == true) {
      if (((data->wildcard).state == CURLWC_CLEAR) &&
         (CVar6 = Curl_wildcard_init(&data->wildcard), CVar6 != CURLE_OK)) {
        return CURLE_OUT_OF_MEMORY;
      }
      CVar6 = CURLE_OK;
    }
  }
  return CVar6;
}

Assistant:

CURLcode Curl_pretransfer(struct Curl_easy *data)
{
  CURLcode result;
  if(!data->change.url) {
    /* we can't do anything without URL */
    failf(data, "No URL set!");
    return CURLE_URL_MALFORMAT;
  }
  /* since the URL may have been redirected in a previous use of this handle */
  if(data->change.url_alloc) {
    /* the already set URL is allocated, free it first! */
    Curl_safefree(data->change.url);
    data->change.url_alloc = FALSE;
  }
  data->change.url = data->set.str[STRING_SET_URL];

  /* Init the SSL session ID cache here. We do it here since we want to do it
     after the *_setopt() calls (that could specify the size of the cache) but
     before any transfer takes place. */
  result = Curl_ssl_initsessions(data, data->set.general_ssl.max_ssl_sessions);
  if(result)
    return result;

  data->state.wildcardmatch = data->set.wildcard_enabled;
  data->set.followlocation = 0; /* reset the location-follow counter */
  data->state.this_is_a_follow = FALSE; /* reset this */
  data->state.errorbuf = FALSE; /* no error has occurred */
  data->state.httpversion = 0; /* don't assume any particular server version */

  data->state.authproblem = FALSE;
  data->state.authhost.want = data->set.httpauth;
  data->state.authproxy.want = data->set.proxyauth;
  Curl_safefree(data->info.wouldredirect);
  data->info.wouldredirect = NULL;

  if(data->set.httpreq == HTTPREQ_PUT)
    data->state.infilesize = data->set.filesize;
  else {
    data->state.infilesize = data->set.postfieldsize;
    if(data->set.postfields && (data->state.infilesize == -1))
      data->state.infilesize = (curl_off_t)strlen(data->set.postfields);
  }

  /* If there is a list of cookie files to read, do it now! */
  if(data->change.cookielist)
    Curl_cookie_loadfiles(data);

  /* If there is a list of host pairs to deal with */
  if(data->change.resolve)
    result = Curl_loadhostpairs(data);

  if(!result) {
    /* Allow data->set.use_port to set which port to use. This needs to be
     * disabled for example when we follow Location: headers to URLs using
     * different ports! */
    data->state.allow_port = TRUE;

#if defined(HAVE_SIGNAL) && defined(SIGPIPE) && !defined(HAVE_MSG_NOSIGNAL)
    /*************************************************************
     * Tell signal handler to ignore SIGPIPE
     *************************************************************/
    if(!data->set.no_signal)
      data->state.prev_signal = signal(SIGPIPE, SIG_IGN);
#endif

    Curl_initinfo(data); /* reset session-specific information "variables" */
    Curl_pgrsResetTransferSizes(data);
    Curl_pgrsStartNow(data);

    if(data->set.timeout)
      Curl_expire(data, data->set.timeout, EXPIRE_TIMEOUT);

    if(data->set.connecttimeout)
      Curl_expire(data, data->set.connecttimeout, EXPIRE_CONNECTTIMEOUT);

    /* In case the handle is re-used and an authentication method was picked
       in the session we need to make sure we only use the one(s) we now
       consider to be fine */
    data->state.authhost.picked &= data->state.authhost.want;
    data->state.authproxy.picked &= data->state.authproxy.want;

    if(data->state.wildcardmatch) {
      struct WildcardData *wc = &data->wildcard;
      if(wc->state < CURLWC_INIT) {
        result = Curl_wildcard_init(wc); /* init wildcard structures */
        if(result)
          return CURLE_OUT_OF_MEMORY;
      }
    }
  }

  return result;
}